

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintHelpText(CommandLineInterface *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::operator<<(poVar1," [OPTION] PROTO_FILES");
  std::operator<<((ostream *)&std::cout,
                  "\nParse PROTO_FILES and generate output based on the options given:\n  -IPATH, --proto_path=PATH   Specify the directory in which to search for\n                              imports.  May be specified multiple times;\n                              directories will be searched in order.  If not\n                              given, the current working directory is used.\n                              If not found in any of the these directories,\n                              the --descriptor_set_in descriptors will be\n                              checked for required proto file.\n  --version                   Show version info and exit.\n  -h, --help                  Show this text and exit.\n  --encode=MESSAGE_TYPE       Read a text-format message of the given type\n                              from standard input and write it in binary\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --deterministic_output      When using --encode, ensure map fields are\n                              deterministically ordered. Note that this order\n                              is not canonical, and changes across builds or\n                              releases of protoc.\n  --decode=MESSAGE_TYPE       Read a binary message of the given type from\n                              standard input and write it in text format\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --decode_raw                Read an arbitrary protocol message from\n                              standard input and write the raw tag/value\n                              pairs in text format to standard output.  No\n                              PROTO_FILES should be given when using this\n                              flag.\n  --descriptor_set_in=FILES   Specifies a delimited list of FILES\n                              each containing a FileDescriptorSet (a\n                       ..." /* TRUNCATED STRING LITERAL */
                 );
  if ((this->plugin_prefix_)._M_string_length != 0) {
    std::operator<<((ostream *)&std::cout,
                    "\n  --plugin=EXECUTABLE         Specifies a plugin executable to use.\n                              Normally, protoc searches the PATH for\n                              plugins, but you may specify additional\n                              executables not in the path using this flag.\n                              Additionally, EXECUTABLE may be of the form\n                              NAME=PATH, in which case the given plugin name\n                              is mapped to the given executable even if\n                              the executable\'s own name differs."
                   );
  }
  for (p_Var2 = (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<(poVar1,"  ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=OUT_DIR ");
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x13' - (char)p_Var2[1]._M_parent);
    poVar1 = std::operator<<(poVar1,(string *)local_50);
    std::operator<<(poVar1,(string *)&p_Var2[4]._M_parent);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::operator<<((ostream *)&std::cout,
                  "\n  @<filename>                 Read options and filenames from file. If a\n                              relative file path is specified, the file\n                              will be searched in the working directory.\n                              The --proto_path option will not affect how\n                              this argument file is searched. Content of\n                              the file will be expanded in the position of\n                              @<filename> as in the argument list. Note\n                              that shell expansion is not applied to the\n                              content of the file (i.e., you cannot use\n                              quotes, wildcards, escapes, commands, etc.).\n                              Each line corresponds to a single argument,\n                              even if it contains spaces."
                 );
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void CommandLineInterface::PrintHelpText() {
  // Sorry for indentation here; line wrapping would be uglier.
  std::cout << "Usage: " << executable_name_ << " [OPTION] PROTO_FILES";
  std::cout << R"(
Parse PROTO_FILES and generate output based on the options given:
  -IPATH, --proto_path=PATH   Specify the directory in which to search for
                              imports.  May be specified multiple times;
                              directories will be searched in order.  If not
                              given, the current working directory is used.
                              If not found in any of the these directories,
                              the --descriptor_set_in descriptors will be
                              checked for required proto file.
  --version                   Show version info and exit.
  -h, --help                  Show this text and exit.
  --encode=MESSAGE_TYPE       Read a text-format message of the given type
                              from standard input and write it in binary
                              to standard output.  The message type must
                              be defined in PROTO_FILES or their imports.
  --deterministic_output      When using --encode, ensure map fields are
                              deterministically ordered. Note that this order
                              is not canonical, and changes across builds or
                              releases of protoc.
  --decode=MESSAGE_TYPE       Read a binary message of the given type from
                              standard input and write it in text format
                              to standard output.  The message type must
                              be defined in PROTO_FILES or their imports.
  --decode_raw                Read an arbitrary protocol message from
                              standard input and write the raw tag/value
                              pairs in text format to standard output.  No
                              PROTO_FILES should be given when using this
                              flag.
  --descriptor_set_in=FILES   Specifies a delimited list of FILES
                              each containing a FileDescriptorSet (a
                              protocol buffer defined in descriptor.proto).
                              The FileDescriptor for each of the PROTO_FILES
                              provided will be loaded from these
                              FileDescriptorSets. If a FileDescriptor
                              appears multiple times, the first occurrence
                              will be used.
  -oFILE,                     Writes a FileDescriptorSet (a protocol buffer,
    --descriptor_set_out=FILE defined in descriptor.proto) containing all of
                              the input files to FILE.
  --include_imports           When using --descriptor_set_out, also include
                              all dependencies of the input files in the
                              set, so that the set is self-contained.
  --include_source_info       When using --descriptor_set_out, do not strip
                              SourceCodeInfo from the FileDescriptorProto.
                              This results in vastly larger descriptors that
                              include information about the original
                              location of each decl in the source file as
                              well as surrounding comments.
  --dependency_out=FILE       Write a dependency output file in the format
                              expected by make. This writes the transitive
                              set of input file paths to FILE
  --error_format=FORMAT       Set the format in which to print errors.
                              FORMAT may be 'gcc' (the default) or 'msvs'
                              (Microsoft Visual Studio format).
  --fatal_warnings            Make warnings be fatal (similar to -Werr in
                              gcc). This flag will make protoc return
                              with a non-zero exit code if any warnings
                              are generated.
  --print_free_field_numbers  Print the free field numbers of the messages
                              defined in the given proto files. Groups share
                              the same field number space with the parent
                              message. Extension ranges are counted as
                              occupied fields numbers.)";
  if (!plugin_prefix_.empty()) {
    std::cout << R"(
  --plugin=EXECUTABLE         Specifies a plugin executable to use.
                              Normally, protoc searches the PATH for
                              plugins, but you may specify additional
                              executables not in the path using this flag.
                              Additionally, EXECUTABLE may be of the form
                              NAME=PATH, in which case the given plugin name
                              is mapped to the given executable even if
                              the executable's own name differs.)";
  }

  for (GeneratorMap::iterator iter = generators_by_flag_name_.begin();
       iter != generators_by_flag_name_.end(); ++iter) {
    // FIXME(kenton):  If the text is long enough it will wrap, which is ugly,
    //   but fixing this nicely (e.g. splitting on spaces) is probably more
    //   trouble than it's worth.
    std::cout << std::endl
              << "  " << iter->first << "=OUT_DIR "
              << std::string(19 - iter->first.size(),
                             ' ')  // Spaces for alignment.
              << iter->second.help_text;
  }
  std::cout << R"(
  @<filename>                 Read options and filenames from file. If a
                              relative file path is specified, the file
                              will be searched in the working directory.
                              The --proto_path option will not affect how
                              this argument file is searched. Content of
                              the file will be expanded in the position of
                              @<filename> as in the argument list. Note
                              that shell expansion is not applied to the
                              content of the file (i.e., you cannot use
                              quotes, wildcards, escapes, commands, etc.).
                              Each line corresponds to a single argument,
                              even if it contains spaces.)";
  std::cout << std::endl;
}